

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist-demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  int local_2c;
  undefined1 local_28 [4];
  int i;
  wordlist_t wordlist;
  char **argv_local;
  int argc_local;
  
  wordlist.tqh_last = (wordentry_t **)argv;
  wordlist_init((wordlist_t *)local_28);
  for (local_2c = 1; local_2c < argc; local_2c = local_2c + 1) {
    wordlist_add((wordlist_t *)local_28,(char *)wordlist.tqh_last[local_2c]);
  }
  wordlist_print((wordlist_t *)local_28);
  wordlist_delete((wordlist_t *)local_28);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    struct wordlist_t wordlist;
    wordlist_init(&wordlist);

    /* add each argument (after 0) to queue; just keep pointer */
    for (int i=1; i < argc; i++)
    {
        wordlist_add(&wordlist, argv[i]);
    }

    wordlist_print(&wordlist);
    wordlist_delete(&wordlist);
}